

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml_quantize_mat_t<8l,(ggml_type)15>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  byte bVar9;
  undefined1 auVar10 [32];
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int k;
  undefined1 *puVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  float *pfVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar36 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar38 [64];
  __m256 iscale_vec [4];
  __m256 srcv [4] [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 auStack_1460 [32];
  undefined1 auStack_1440 [32];
  undefined1 auStack_1420 [32];
  undefined1 auStack_1400 [32];
  undefined1 auStack_13e0 [32];
  undefined1 auStack_13c0 [32];
  undefined1 auStack_13a0 [32];
  undefined1 auStack_1380 [800];
  float local_1060 [8];
  undefined1 auStack_1040 [32];
  undefined1 auStack_1020 [32];
  undefined1 auStack_1000 [128];
  undefined1 local_f80 [800];
  float afStack_c60 [256];
  undefined1 auStack_860 [1024];
  undefined1 auStack_460 [1072];
  
  auVar10 = _DAT_0015bd80;
  auVar4 = vpmovsxbw_avx2(_DAT_0015bf40);
  auVar34[8] = 1;
  auVar34._0_8_ = 0x101010101010101;
  auVar34[9] = 1;
  auVar34[10] = 1;
  auVar34[0xb] = 1;
  auVar34[0xc] = 1;
  auVar34[0xd] = 1;
  auVar34[0xe] = 1;
  auVar34[0xf] = 1;
  auVar34[0x10] = 1;
  auVar34[0x11] = 1;
  auVar34[0x12] = 1;
  auVar34[0x13] = 1;
  auVar34[0x14] = 1;
  auVar34[0x15] = 1;
  auVar34[0x16] = 1;
  auVar34[0x17] = 1;
  auVar34[0x18] = 1;
  auVar34[0x19] = 1;
  auVar34[0x1a] = 1;
  auVar34[0x1b] = 1;
  auVar34[0x1c] = 1;
  auVar34[0x1d] = 1;
  auVar34[0x1e] = 1;
  auVar34[0x1f] = 1;
  lVar16 = (long)vy + 0x10;
  uVar17 = 0;
  uVar11 = (uint)(n_per_row / 0x100);
  pfVar18 = x + 0x38;
  auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x703060205010400));
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  auVar35._16_4_ = 0x7fffffff;
  auVar35._20_4_ = 0x7fffffff;
  auVar35._24_4_ = 0x7fffffff;
  auVar35._28_4_ = 0x7fffffff;
  auVar3 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
  auVar29 = auVar24;
  for (; uVar17 != (~((int)uVar11 >> 0x1f) & uVar11); uVar17 = uVar17 + 1) {
    puVar15 = local_f80;
    pfVar19 = pfVar18;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      lVar13 = lVar14 * n_per_row;
      auVar26 = *(undefined1 (*) [32])(x + uVar17 * 0x100 + lVar13);
      auVar27 = *(undefined1 (*) [32])(x + uVar17 * 0x100 + lVar13 + 8);
      auVar28 = *(undefined1 (*) [32])(x + uVar17 * 0x100 + lVar13 + 0x10);
      auVar36 = *(undefined1 (*) [32])(x + uVar17 * 0x100 + lVar13 + 0x18);
      lVar13 = lVar14 * 0x400;
      auVar32 = vandps_avx(auVar26,auVar35);
      auVar30 = vandps_avx(auVar27,auVar35);
      *(undefined1 (*) [32])(local_1060 + lVar14 * 0x100) = auVar26;
      *(undefined1 (*) [32])(auStack_1040 + lVar13) = auVar27;
      *(undefined1 (*) [32])(auStack_1020 + lVar13) = auVar28;
      *(undefined1 (*) [32])(auStack_1000 + lVar13) = auVar36;
      lVar13 = 0;
      auVar30 = vmaxps_avx(auVar32,auVar30);
      auVar32 = vandps_avx(auVar28,auVar35);
      auVar30 = vmaxps_avx(auVar30,auVar32);
      auVar32 = vandps_avx(auVar36,auVar35);
      auVar32 = vmaxps_avx(auVar30,auVar32);
      uVar5 = vcmpps_avx512vl(auVar32,auVar26,0);
      uVar22 = vcmpps_avx512vl(auVar32,auVar27,0);
      uVar6 = vcmpps_avx512vl(auVar32,auVar36,0);
      uVar7 = vcmpps_avx512vl(auVar32,auVar28,0);
      auVar26 = vpmovm2d_avx512vl((ulong)(byte)((byte)uVar5 | (byte)uVar22 |
                                               (byte)uVar6 | (byte)uVar7));
      while( true ) {
        in_ZMM15 = ZEXT3264(auVar36);
        in_ZMM14 = ZEXT3264(auVar28);
        if (lVar13 == 0x380) break;
        auVar27 = *(undefined1 (*) [32])((long)pfVar19 + lVar13 + -0x60);
        auVar30 = *(undefined1 (*) [32])((long)pfVar19 + lVar13 + -0x40);
        auVar28 = *(undefined1 (*) [32])((long)pfVar19 + lVar13 + -0x20);
        auVar36 = *(undefined1 (*) [32])((long)pfVar19 + lVar13);
        vandps_avx512vl(auVar27,auVar35);
        vandps_avx512vl(auVar30,auVar35);
        vandps_avx512vl(auVar28,auVar35);
        vandps_avx512vl(auVar36,auVar35);
        *(undefined1 (*) [32])(puVar15 + lVar13 + -0x60) = auVar27;
        *(undefined1 (*) [32])(puVar15 + lVar13 + -0x40) = auVar30;
        *(undefined1 (*) [32])(puVar15 + lVar13 + -0x20) = auVar28;
        *(undefined1 (*) [32])(puVar15 + lVar13) = auVar36;
        lVar13 = lVar13 + 0x80;
        auVar25 = vmaxps_avx512vl(auVar32,auVar29);
        auVar25 = vmaxps_avx512vl(auVar25,auVar29);
        auVar25 = vmaxps_avx512vl(auVar25,auVar29);
        auVar25 = vmaxps_avx512vl(auVar25,auVar29);
        uVar8 = vcmpps_avx512vl(auVar32,auVar25,0);
        uVar5 = vcmpps_avx512vl(auVar25,auVar27,0);
        uVar22 = vcmpps_avx512vl(auVar25,auVar36,0);
        auVar26 = vmovdqa32_avx512vl(auVar26);
        uVar6 = vcmpps_avx512vl(auVar25,auVar30,0);
        uVar7 = vcmpps_avx512vl(auVar25,auVar28,0);
        bVar9 = (byte)uVar5 | (byte)uVar6 | (byte)uVar22 | (byte)uVar7;
        auVar27 = vmovdqa32_avx512vl(auVar3);
        auVar29._0_4_ =
             (uint)(bVar9 & 1) * auVar27._0_4_ |
             (uint)!(bool)(bVar9 & 1) * (uint)((byte)uVar8 & 1) * auVar26._0_4_;
        bVar20 = (bool)(bVar9 >> 1 & 1);
        auVar29._4_4_ =
             (uint)bVar20 * auVar27._4_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 1) & 1) * auVar26._4_4_;
        bVar20 = (bool)(bVar9 >> 2 & 1);
        auVar29._8_4_ =
             (uint)bVar20 * auVar27._8_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 2) & 1) * auVar26._8_4_;
        bVar20 = (bool)(bVar9 >> 3 & 1);
        auVar29._12_4_ =
             (uint)bVar20 * auVar27._12_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 3) & 1) * auVar26._12_4_;
        bVar20 = (bool)(bVar9 >> 4 & 1);
        auVar29._16_4_ =
             (uint)bVar20 * auVar27._16_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 4) & 1) * auVar26._16_4_;
        bVar20 = (bool)(bVar9 >> 5 & 1);
        auVar29._20_4_ =
             (uint)bVar20 * auVar27._20_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 5) & 1) * auVar26._20_4_;
        bVar20 = (bool)(bVar9 >> 6 & 1);
        auVar29._24_4_ =
             (uint)bVar20 * auVar27._24_4_ |
             (uint)!bVar20 * (uint)((byte)(uVar8 >> 6) & 1) * auVar26._24_4_;
        auVar29._28_4_ =
             (uint)(bVar9 >> 7) * auVar27._28_4_ |
             (uint)!(bool)(bVar9 >> 7) * (uint)(byte)(uVar8 >> 7) * auVar26._28_4_;
        auVar26 = auVar29;
        auVar32 = auVar25;
      }
      uVar22 = vpmovd2m_avx512vl(auVar26);
      auVar1 = vmaxps_avx(auVar32._16_16_,auVar32._0_16_);
      auVar2 = vshufpd_avx(auVar1,auVar1,3);
      auVar1 = vmaxps_avx(auVar1,auVar2);
      auVar2 = vmovshdup_avx(auVar1);
      auVar1 = vmaxss_avx(auVar1,auVar2);
      fVar23 = auVar1._0_4_;
      auVar28._4_4_ = fVar23;
      auVar28._0_4_ = fVar23;
      auVar28._8_4_ = fVar23;
      auVar28._12_4_ = fVar23;
      auVar28._16_4_ = fVar23;
      auVar28._20_4_ = fVar23;
      auVar28._24_4_ = fVar23;
      auVar28._28_4_ = fVar23;
      bVar20 = fVar23 != 0.0;
      uVar5 = vcmpps_avx512vl(auVar28,auVar32,0);
      bVar21 = (byte)((byte)uVar5 & (byte)uVar22) == 0;
      puVar15 = puVar15 + 0x400;
      pfVar19 = pfVar19 + n_per_row;
      auVar26._16_16_ = auVar29._16_16_;
      fVar23 = (float)((uint)bVar21 * (uint)bVar20 * (int)(127.0 / fVar23) +
                      (uint)!bVar21 * (uint)bVar20 * (int)(-127.0 / fVar23));
      auVar27._4_4_ = fVar23;
      auVar27._0_4_ = fVar23;
      auVar27._8_4_ = fVar23;
      auVar27._12_4_ = fVar23;
      auVar27._16_4_ = fVar23;
      auVar27._20_4_ = fVar23;
      auVar27._24_4_ = fVar23;
      auVar27._28_4_ = fVar23;
      *(undefined1 (*) [32])(&local_14e0 + lVar14 * 8) = auVar27;
      auVar26._0_16_ = ZEXT416((uint)(1.0 / fVar23));
      iVar12 = (uint)bVar20 * (int)(1.0 / fVar23);
      auVar29._4_28_ = auVar26._4_28_;
      auVar29._0_4_ = iVar12;
      *(int *)((long)vy + lVar14 * 4 + uVar17 * 0x490) = iVar12;
    }
    for (lVar14 = 0; lVar14 != 0x400; lVar14 = lVar14 + 0x20) {
      auVar37._0_4_ = local_14e0 * *(float *)((long)local_1060 + lVar14);
      auVar37._4_4_ = fStack_14dc * *(float *)((long)local_1060 + lVar14 + 4);
      auVar37._8_4_ = fStack_14d8 * *(float *)((long)local_1060 + lVar14 + 8);
      auVar37._12_4_ = fStack_14d4 * *(float *)((long)local_1060 + lVar14 + 0xc);
      auVar37._16_4_ = fStack_14d0 * *(float *)((long)local_1060 + lVar14 + 0x10);
      auVar37._20_4_ = fStack_14cc * *(float *)((long)local_1060 + lVar14 + 0x14);
      auVar37._28_36_ = in_ZMM14._28_36_;
      auVar37._24_4_ = fStack_14c8 * *(float *)((long)local_1060 + lVar14 + 0x18);
      auVar38._0_4_ = local_14c0 * *(float *)((long)afStack_c60 + lVar14);
      auVar38._4_4_ = fStack_14bc * *(float *)((long)afStack_c60 + lVar14 + 4);
      auVar38._8_4_ = fStack_14b8 * *(float *)((long)afStack_c60 + lVar14 + 8);
      auVar38._12_4_ = fStack_14b4 * *(float *)((long)afStack_c60 + lVar14 + 0xc);
      auVar38._16_4_ = fStack_14b0 * *(float *)((long)afStack_c60 + lVar14 + 0x10);
      auVar38._20_4_ = fStack_14ac * *(float *)((long)afStack_c60 + lVar14 + 0x14);
      auVar38._28_36_ = in_ZMM15._28_36_;
      auVar38._24_4_ = fStack_14a8 * *(float *)((long)afStack_c60 + lVar14 + 0x18);
      auVar27 = vmulps_avx512vl(local_14a0,*(undefined1 (*) [32])(auStack_860 + lVar14));
      auVar28 = vmulps_avx512vl(local_1480,*(undefined1 (*) [32])(auStack_460 + lVar14));
      auVar29 = vroundps_avx(auVar37._0_32_,0);
      auVar26 = vroundps_avx(auVar38._0_32_,0);
      auVar28 = vrndscaleps_avx512vl(auVar28,0);
      auVar27 = vrndscaleps_avx512vl(auVar27,0);
      auVar29 = vcvtps2dq_avx(auVar29);
      auVar26 = vcvtps2dq_avx(auVar26);
      auVar28 = vcvtps2dq_avx512vl(auVar28);
      auVar29 = vpackssdw_avx2(auVar29,auVar26);
      auVar26 = vcvtps2dq_avx512vl(auVar27);
      auVar26 = vpackssdw_avx2(auVar26,auVar28);
      in_ZMM15 = ZEXT3264(auVar26);
      auVar29 = vpacksswb_avx2(auVar29,auVar26);
      auVar29 = vpermd_avx512vl(auVar24,auVar29);
      in_ZMM14 = ZEXT3264(auVar29);
      *(undefined1 (*) [32])(lVar16 + lVar14) = auVar29;
      *(undefined1 (*) [32])(auStack_1460 + lVar14) = auVar29;
    }
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      lVar13 = lVar14 * 0x100;
      auVar30 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_1420 + lVar13));
      auVar29 = *(undefined1 (*) [32])(auStack_1460 + lVar13);
      auVar25 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_13e0 + lVar13));
      auVar31 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_13a0 + lVar13));
      auVar26 = *(undefined1 (*) [32])(auStack_1440 + lVar13);
      auVar27 = *(undefined1 (*) [32])(auStack_1400 + lVar13);
      auVar28 = *(undefined1 (*) [32])(auStack_13c0 + lVar13);
      auVar36 = *(undefined1 (*) [32])(auStack_1380 + lVar13);
      iVar12 = 3;
      auVar32 = vpslld_avx512vl(auVar30,0x10);
      auVar32 = vpblendw_avx2(auVar29,auVar32,0x22);
      auVar32 = vpermt2d_avx512vl(auVar32,auVar10,auVar25);
      auVar32 = vpermt2w_avx512vl(auVar32,auVar4,auVar31);
      auVar32 = vpmaddubsw_avx2(auVar34,auVar32);
      while( true ) {
        in_ZMM14 = ZEXT3264(auVar32);
        bVar20 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if (bVar20) break;
        auVar30 = vpsrlq_avx512vl(auVar30,0x10);
        auVar29 = vpsrlq_avx2(auVar29,0x10);
        auVar25 = vpsrlq_avx512vl(auVar25,0x10);
        auVar31 = vpsrlq_avx512vl(auVar31,0x10);
        auVar33 = vpslld_avx512vl(auVar30,0x10);
        auVar33 = vpblendw_avx2(auVar29,auVar33,0x22);
        auVar33 = vpermt2d_avx512vl(auVar33,auVar10,auVar25);
        auVar33 = vpermt2w_avx512vl(auVar33,auVar4,auVar31);
        auVar33 = vpmaddubsw_avx2(auVar34,auVar33);
        auVar32 = vpaddw_avx2(auVar32,auVar33);
      }
      auVar29 = vpslld_avx2(auVar27,0x10);
      iVar12 = 3;
      auVar29 = vpblendw_avx2(auVar26,auVar29,0x22);
      auVar29 = vpermt2d_avx512vl(auVar29,auVar10,auVar28);
      auVar29 = vpermt2w_avx512vl(auVar29,auVar4,auVar36);
      auVar30 = vpmaddubsw_avx2(auVar34,auVar29);
      while( true ) {
        in_ZMM15 = ZEXT3264(auVar30);
        bVar20 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if (bVar20) break;
        auVar27 = vpsrlq_avx2(auVar27,0x10);
        auVar26 = vpsrlq_avx2(auVar26,0x10);
        auVar28 = vpsrlq_avx2(auVar28,0x10);
        auVar36 = vpsrlq_avx2(auVar36,0x10);
        auVar29 = vpslld_avx2(auVar27,0x10);
        auVar29 = vpblendw_avx2(auVar26,auVar29,0x22);
        auVar29 = vpermt2d_avx512vl(auVar29,auVar10,auVar28);
        auVar29 = vpermt2w_avx512vl(auVar29,auVar4,auVar36);
        auVar25 = vpmaddubsw_avx2(auVar34,auVar29);
        auVar30 = vpaddw_avx2(auVar30,auVar25);
      }
      auVar26 = vpaddw_avx2(auVar30,auVar32);
      *(undefined1 (*) [32])((long)vy + lVar14 * 0x20 + uVar17 * 0x490 + 0x410) = auVar26;
    }
    pfVar18 = pfVar18 + 0x100;
    lVar16 = lVar16 + 0x490;
  }
  return;
}

Assistant:

void ggml_quantize_mat_t<8, GGML_TYPE_Q8_K>(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t nrow, int64_t n_per_row) {
    assert(nrow == 4);
    UNUSED(nrow);
    ggml_quantize_mat_q8_K_4x8(x, vy, n_per_row);
}